

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cstring.cpp
# Opt level: O0

UBool uprv_isASCIILetter_63(char c)

{
  bool local_b;
  bool local_a;
  char c_local;
  
  if ((c < 'a') || (local_a = true, 'z' < c)) {
    local_b = '@' < c && c < '[';
    local_a = local_b;
  }
  return local_a;
}

Assistant:

U_CAPI UBool U_EXPORT2
uprv_isASCIILetter(char c) {
#if U_CHARSET_FAMILY==U_EBCDIC_FAMILY
    return
        ('a'<=c && c<='i') || ('j'<=c && c<='r') || ('s'<=c && c<='z') ||
        ('A'<=c && c<='I') || ('J'<=c && c<='R') || ('S'<=c && c<='Z');
#else
    return ('a'<=c && c<='z') || ('A'<=c && c<='Z');
#endif
}